

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_run_blep(resampler *r,float **out_,float *out_end)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  ulong in_RDX;
  long *in_RSI;
  int *in_RDI;
  double dVar9;
  double sample;
  int window_step;
  int step;
  bigint inv_phase_inc;
  bigint inv_phase;
  double last_amp;
  float *in_end;
  float *in;
  float *out;
  int used;
  float *in_;
  int in_size;
  int local_18c;
  double local_180;
  double adStack_178 [31];
  int window_pos;
  int pos;
  int i;
  int phase_adj;
  int phase_reduced;
  double kernel_sum;
  ulong local_58;
  double local_50;
  float *local_40;
  long local_38;
  int local_2c;
  
  iVar3 = in_RDI[1];
  pfVar7 = (float *)(in_RDI + (long)*in_RDI + (0x52 - (long)in_RDI[1]));
  local_2c = 0;
  if (0 < iVar3 + -1) {
    local_38 = *in_RSI;
    local_50 = *(double *)(in_RDI + 0xe);
    local_58 = *(ulong *)(in_RDI + 8);
    lVar4 = *(long *)(in_RDI + 10);
    local_40 = pfVar7;
    do {
      if (in_RDX < local_38 + 0x80U) break;
      pfVar8 = local_40 + 1;
      dVar9 = (double)*local_40 - local_50;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        local_180 = 0.0;
        iVar5 = (int)(local_58 >> 0x16);
        for (local_18c = 0x10; -0x10 < local_18c; local_18c = local_18c + -1) {
          iVar6 = (iVar5 * 0x399) / 0x400 + local_18c * -0x399;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          fVar1 = sinc_lut[iVar6];
          iVar6 = iVar5 + local_18c * -0x400;
          if (iVar6 < 1) {
            iVar6 = -iVar6;
          }
          fVar2 = window_lut[iVar6];
          adStack_178[local_18c + 0xf] = (double)(fVar1 * fVar2);
          local_180 = (double)(fVar1 * fVar2) + local_180;
        }
        local_50 = dVar9 + local_50;
        for (local_18c = 0; local_18c < 0x20; local_18c = local_18c + 1) {
          *(float *)(local_38 + (long)local_18c * 4) =
               (float)((dVar9 / local_180) * adStack_178[local_18c]) +
               *(float *)(local_38 + (long)local_18c * 4);
        }
      }
      local_38 = (lVar4 + local_58 >> 0x20) * 4 + local_38;
      local_58 = lVar4 + local_58 & 0xffffffff;
      local_40 = pfVar8;
    } while (pfVar8 < pfVar7 + (iVar3 + -1));
    *(ulong *)(in_RDI + 8) = local_58;
    *(double *)(in_RDI + 0xe) = local_50;
    *in_RSI = local_38;
    local_2c = (int)((long)local_40 - (long)pfVar7 >> 2);
    in_RDI[1] = in_RDI[1] - local_2c;
  }
  return local_2c;
}

Assistant:

static int resampler_run_blep(resampler * r, float ** out_, float * out_end)
{
    int in_size = r->write_filled;
    float const* in_ = r->buffer_in + resampler_buffer_size + r->write_pos - r->write_filled;
    int used = 0;
    in_size -= 1;
    if ( in_size > 0 )
    {
        float* out = *out_;
        float const* in = in_;
        float const* const in_end = in + in_size;
        double last_amp = r->last_amp;
        bigint inv_phase = r->inv_phase;
        bigint inv_phase_inc = r->inv_phase_inc;

        const int step = (int)(RESAMPLER_BLEP_CUTOFF * RESAMPLER_RESOLUTION);
        const int window_step = RESAMPLER_RESOLUTION;
        
        do
        {
            double sample;
            
            if ( out + SINC_WIDTH * 2 > out_end )
                break;
            
            sample = *in++ - last_amp;
            
            if (sample)
            {
                double kernel[SINC_WIDTH * 2], kernel_sum = 0.0f;
                int phase_reduced = PHASE_REDUCE(inv_phase);
                int phase_adj = phase_reduced * step / RESAMPLER_RESOLUTION;
                int i = SINC_WIDTH;

                for (; i >= -SINC_WIDTH + 1; --i)
                {
                    int pos = i * step;
                    int window_pos = i * window_step;
                    kernel_sum += kernel[i + SINC_WIDTH - 1] = sinc_lut[abs(phase_adj - pos)] * window_lut[abs(phase_reduced - window_pos)];
                }
                last_amp += sample;
                sample /= kernel_sum;
                for (i = 0; i < SINC_WIDTH * 2; ++i)
                    out[i] += (float)(sample * kernel[i]);
            }
            
            inv_phase.quad += inv_phase_inc.quad;
            
            ADD_HI(out, inv_phase);
            
            CLEAR_HI(inv_phase);
        }
        while ( in < in_end );
        
        r->inv_phase = inv_phase;
        r->last_amp = last_amp;
        *out_ = out;
        
        used = (int)(in - in_);
        
        r->write_filled -= used;
    }
    
    return used;
}